

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O3

SQInteger __thiscall SQLexer::ReadNumber(SQLexer *this)

{
  SQUnsignedInteger SVar1;
  int iVar2;
  SQInteger SVar3;
  char *pcVar4;
  ulong uVar5;
  byte bVar6;
  void *pvVar7;
  LexChar LVar8;
  SQUnsignedInteger SVar9;
  long lVar10;
  SQChar *sTemp;
  char local_39 [9];
  
  LVar8 = this->_currdata;
  local_39[0] = '\0';
  sqvector<char>::resize(&this->_longstr,0,local_39);
  SVar3 = (*this->_readf)(this->_up);
  if (SVar3 < 0x100) {
    if (SVar3 != 0) goto LAB_0011b2e9;
    this->_currdata = '\0';
    this->_reached_eof = 1;
    SVar3 = 0;
  }
  else {
    (*this->_errfunc)(this->_errtarget,"Invalid character");
LAB_0011b2e9:
    this->_currdata = (LexChar)SVar3;
  }
  this->_currentcolumn = this->_currentcolumn + 1;
  if (LVar8 != '0') {
LAB_0011b3e4:
    SVar1 = (this->_longstr)._allocated;
    pcVar4 = (this->_longstr)._vals;
    uVar5 = (this->_longstr)._size;
    if (SVar1 <= uVar5) {
      SVar9 = 4;
      if (uVar5 * 2 != 0) {
        SVar9 = uVar5 * 2;
      }
      pcVar4 = (char *)sq_vm_realloc(pcVar4,SVar1,SVar9);
      (this->_longstr)._vals = pcVar4;
      (this->_longstr)._allocated = SVar9;
      uVar5 = (this->_longstr)._size;
    }
    (this->_longstr)._size = uVar5 + 1;
    pcVar4[uVar5] = LVar8;
    uVar5 = (ulong)this->_currdata;
    lVar10 = 1;
    do {
      bVar6 = (byte)uVar5;
      if ((bVar6 == 0x2e) || (((uint)uVar5 & 0xff) - 0x30 < 10)) {
        if (bVar6 == 0x2e) {
          lVar10 = 2;
          bVar6 = 0x2e;
        }
        else if ((bVar6 & 0xdf) == 0x45) goto LAB_0011b482;
      }
      else {
        if ((bVar6 & 0xdf) != 0x45) goto LAB_0011b792;
LAB_0011b482:
        SVar1 = (this->_longstr)._allocated;
        pcVar4 = (this->_longstr)._vals;
        uVar5 = (this->_longstr)._size;
        if (SVar1 <= uVar5) {
          SVar9 = uVar5 * 2;
          if (SVar9 == 0) {
            SVar9 = 4;
          }
          pcVar4 = (char *)sq_vm_realloc(pcVar4,SVar1,SVar9);
          (this->_longstr)._vals = pcVar4;
          (this->_longstr)._allocated = SVar9;
          uVar5 = (this->_longstr)._size;
        }
        (this->_longstr)._size = uVar5 + 1;
        pcVar4[uVar5] = bVar6;
        SVar3 = (*this->_readf)(this->_up);
        if (SVar3 < 0x100) {
          if (SVar3 != 0) goto LAB_0011b4f0;
          this->_currdata = '\0';
          this->_reached_eof = 1;
          this->_currentcolumn = this->_currentcolumn + 1;
        }
        else {
          (*this->_errfunc)(this->_errtarget,"Invalid character");
LAB_0011b4f0:
          LVar8 = (LexChar)SVar3;
          this->_currdata = LVar8;
          this->_currentcolumn = this->_currentcolumn + 1;
          if ((LVar8 == '-') || (((uint)SVar3 & 0xff) == 0x2b)) {
            SVar1 = (this->_longstr)._allocated;
            pcVar4 = (this->_longstr)._vals;
            uVar5 = (this->_longstr)._size;
            if (SVar1 <= uVar5) {
              SVar9 = uVar5 * 2;
              if (SVar9 == 0) {
                SVar9 = 4;
              }
              pcVar4 = (char *)sq_vm_realloc(pcVar4,SVar1,SVar9);
              (this->_longstr)._vals = pcVar4;
              (this->_longstr)._allocated = SVar9;
              uVar5 = (this->_longstr)._size;
            }
            (this->_longstr)._size = uVar5 + 1;
            pcVar4[uVar5] = LVar8;
            SVar3 = (*this->_readf)(this->_up);
            if (SVar3 < 0x100) {
              if (SVar3 != 0) goto LAB_0011b575;
              this->_currdata = '\0';
              this->_reached_eof = 1;
              SVar3 = 0;
            }
            else {
              (*this->_errfunc)(this->_errtarget,"Invalid character");
LAB_0011b575:
              this->_currdata = (LexChar)SVar3;
            }
            this->_currentcolumn = this->_currentcolumn + 1;
          }
          bVar6 = (byte)SVar3;
          lVar10 = 4;
          if (((uint)SVar3 & 0xff) - 0x30 < 10) goto LAB_0011b5bf;
        }
        (*this->_errfunc)(this->_errtarget,"exponent expected");
        bVar6 = this->_currdata;
        lVar10 = 4;
      }
LAB_0011b5bf:
      SVar1 = (this->_longstr)._allocated;
      pcVar4 = (this->_longstr)._vals;
      uVar5 = (this->_longstr)._size;
      if (SVar1 <= uVar5) {
        SVar9 = uVar5 * 2;
        if (SVar9 == 0) {
          SVar9 = 4;
        }
        pcVar4 = (char *)sq_vm_realloc(pcVar4,SVar1,SVar9);
        (this->_longstr)._vals = pcVar4;
        (this->_longstr)._allocated = SVar9;
        uVar5 = (this->_longstr)._size;
      }
      (this->_longstr)._size = uVar5 + 1;
      pcVar4[uVar5] = bVar6;
      uVar5 = (*this->_readf)(this->_up);
      if ((long)uVar5 < 0x100) {
        if (uVar5 != 0) goto LAB_0011b629;
        this->_currdata = '\0';
        this->_reached_eof = 1;
        uVar5 = 0;
      }
      else {
        (*this->_errfunc)(this->_errtarget,"Invalid character");
LAB_0011b629:
        this->_currdata = (LexChar)uVar5;
      }
      this->_currentcolumn = this->_currentcolumn + 1;
    } while( true );
  }
  iVar2 = toupper((uint)SVar3 & 0xff);
  bVar6 = (byte)SVar3 & 0xf8;
  if (iVar2 != 0x58 && bVar6 != 0x30) goto LAB_0011b3e4;
  if (bVar6 == 0x30) {
    do {
      SVar1 = (this->_longstr)._allocated;
      pcVar4 = (this->_longstr)._vals;
      uVar5 = (this->_longstr)._size;
      if (SVar1 <= uVar5) {
        SVar9 = uVar5 * 2;
        if (SVar9 == 0) {
          SVar9 = 4;
        }
        pcVar4 = (char *)sq_vm_realloc(pcVar4,SVar1,SVar9);
        (this->_longstr)._vals = pcVar4;
        (this->_longstr)._allocated = SVar9;
        uVar5 = (this->_longstr)._size;
      }
      (this->_longstr)._size = uVar5 + 1;
      pcVar4[uVar5] = (char)SVar3;
      SVar3 = (*this->_readf)(this->_up);
      if (SVar3 < 0x100) {
        if (SVar3 == 0) {
          this->_currdata = '\0';
          this->_reached_eof = 1;
          this->_currentcolumn = this->_currentcolumn + 1;
          lVar10 = 5;
          goto LAB_0011b792;
        }
      }
      else {
        (*this->_errfunc)(this->_errtarget,"Invalid character");
      }
      this->_currdata = (byte)SVar3;
      this->_currentcolumn = this->_currentcolumn + 1;
    } while (((byte)SVar3 & 0xf8) == 0x30);
    lVar10 = 5;
    if (9 < ((uint)SVar3 & 0xfe) - 0x30) goto LAB_0011b792;
    pvVar7 = this->_errtarget;
    pcVar4 = "invalid octal number";
  }
  else {
    SVar3 = (*this->_readf)(this->_up);
    if (SVar3 < 0x100) {
      if (SVar3 != 0) goto LAB_0011b6a0;
      this->_currdata = '\0';
      this->_reached_eof = 1;
      SVar3 = 0;
    }
    else {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
LAB_0011b6a0:
      this->_currdata = (LexChar)SVar3;
    }
    this->_currentcolumn = this->_currentcolumn + 1;
    iVar2 = isxdigit((uint)SVar3 & 0xff);
    while (iVar2 != 0) {
      SVar1 = (this->_longstr)._allocated;
      pcVar4 = (this->_longstr)._vals;
      uVar5 = (this->_longstr)._size;
      if (SVar1 <= uVar5) {
        SVar9 = uVar5 * 2;
        if (SVar9 == 0) {
          SVar9 = 4;
        }
        pcVar4 = (char *)sq_vm_realloc(pcVar4,SVar1,SVar9);
        (this->_longstr)._vals = pcVar4;
        (this->_longstr)._allocated = SVar9;
        uVar5 = (this->_longstr)._size;
      }
      (this->_longstr)._size = uVar5 + 1;
      pcVar4[uVar5] = (char)SVar3;
      SVar3 = (*this->_readf)(this->_up);
      if (SVar3 < 0x100) {
        if (SVar3 != 0) goto LAB_0011b731;
        this->_currdata = '\0';
        this->_reached_eof = 1;
        SVar3 = 0;
      }
      else {
        (*this->_errfunc)(this->_errtarget,"Invalid character");
LAB_0011b731:
        this->_currdata = (LexChar)SVar3;
      }
      this->_currentcolumn = this->_currentcolumn + 1;
      iVar2 = isxdigit((uint)SVar3 & 0xff);
    }
    lVar10 = 3;
    if ((this->_longstr)._size < 0x11) goto LAB_0011b792;
    pvVar7 = this->_errtarget;
    pcVar4 = "too many digits for an Hex number";
  }
  (*this->_errfunc)(pvVar7,pcVar4);
LAB_0011b792:
  SVar1 = (this->_longstr)._allocated;
  pcVar4 = (this->_longstr)._vals;
  uVar5 = (this->_longstr)._size;
  if (SVar1 <= uVar5) {
    SVar9 = 4;
    if (uVar5 * 2 != 0) {
      SVar9 = uVar5 * 2;
    }
    pcVar4 = (char *)sq_vm_realloc(pcVar4,SVar1,SVar9);
    (this->_longstr)._vals = pcVar4;
    (this->_longstr)._allocated = SVar9;
    uVar5 = (this->_longstr)._size;
  }
  (this->_longstr)._size = uVar5 + 1;
  pcVar4[uVar5] = '\0';
  SVar3 = (*(code *)(&DAT_00131388 + *(int *)(&DAT_00131388 + (lVar10 + -1) * 4)))();
  return SVar3;
}

Assistant:

SQInteger SQLexer::ReadNumber()
{
#define TINT 1
#define TFLOAT 2
#define THEX 3
#define TSCIENTIFIC 4
#define TOCTAL 5
    SQInteger type = TINT, firstchar = CUR_CHAR;
    SQChar *sTemp;
    INIT_TEMP_STRING();
    NEXT();
    if(firstchar == _SC('0') && (toupper(CUR_CHAR) == _SC('X') || scisodigit(CUR_CHAR)) ) {
        if(scisodigit(CUR_CHAR)) {
            type = TOCTAL;
            while(scisodigit(CUR_CHAR)) {
                APPEND_CHAR(CUR_CHAR);
                NEXT();
            }
            if(scisdigit(CUR_CHAR)) Error(_SC("invalid octal number"));
        }
        else {
            NEXT();
            type = THEX;
            while(isxdigit(CUR_CHAR)) {
                APPEND_CHAR(CUR_CHAR);
                NEXT();
            }
            if(_longstr.size() > MAX_HEX_DIGITS) Error(_SC("too many digits for an Hex number"));
        }
    }
    else {
        APPEND_CHAR((int)firstchar);
        while (CUR_CHAR == _SC('.') || scisdigit(CUR_CHAR) || isexponent(CUR_CHAR)) {
            if(CUR_CHAR == _SC('.') || isexponent(CUR_CHAR)) type = TFLOAT;
            if(isexponent(CUR_CHAR)) {
                if(type != TFLOAT) Error(_SC("invalid numeric format"));
                type = TSCIENTIFIC;
                APPEND_CHAR(CUR_CHAR);
                NEXT();
                if(CUR_CHAR == '+' || CUR_CHAR == '-'){
                    APPEND_CHAR(CUR_CHAR);
                    NEXT();
                }
                if(!scisdigit(CUR_CHAR)) Error(_SC("exponent expected"));
            }

            APPEND_CHAR(CUR_CHAR);
            NEXT();
        }
    }
    TERMINATE_BUFFER();
    switch(type) {
    case TSCIENTIFIC:
    case TFLOAT:
        _fvalue = (SQFloat)scstrtod(&_longstr[0],&sTemp);
        return TK_FLOAT;
    case TINT:
        LexInteger(&_longstr[0],(SQUnsignedInteger *)&_nvalue);
        return TK_INTEGER;
    case THEX:
        LexHexadecimal(&_longstr[0],(SQUnsignedInteger *)&_nvalue);
        return TK_INTEGER;
    case TOCTAL:
        LexOctal(&_longstr[0],(SQUnsignedInteger *)&_nvalue);
        return TK_INTEGER;
    }
    return 0;
}